

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::applyParams
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandedDecl *this,Array<capnp::compiler::NodeTranslator::BrandedDecl> *params,
          Reader subSource)

{
  BrandScope *pBVar1;
  undefined8 *puVar2;
  Refcounted *pRVar3;
  Refcounted *pRVar4;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *pNVar5;
  BrandedDecl *pBVar6;
  Disposer *pDVar7;
  undefined1 local_e8 [8];
  BrandScope *pBStack_e0;
  BrandedDecl *local_d8;
  Disposer *pDStack_d0;
  BrandScope *local_c8;
  BrandedDecl local_c0;
  
  if ((this->body).tag == 2) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    pBVar1 = (this->brand).ptr;
    local_d8 = params->ptr;
    pDStack_d0 = (Disposer *)params->size_;
    local_c8 = (BrandScope *)params->disposer;
    params->ptr = (BrandedDecl *)0x0;
    params->size_ = 0;
    BrandScope::setParams
              ((BrandScope *)local_e8,(Array<capnp::compiler::NodeTranslator::BrandedDecl> *)pBVar1,
               (Which)&local_d8,subSource);
    if (pBStack_e0 == (BrandScope *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      BrandedDecl(&local_c0,this);
      puVar2 = (undefined8 *)CONCAT44(local_c0.brand.disposer._4_4_,local_c0.brand.disposer._0_4_);
      local_c0.brand.disposer._0_4_ = local_e8._0_4_;
      local_c0.brand.disposer._4_4_ = local_e8._4_4_;
      pBVar1 = pBStack_e0;
      pBStack_e0 = (BrandScope *)0x0;
      if (local_c0.brand.ptr != (BrandScope *)0x0) {
        pRVar3 = &(local_c0.brand.ptr)->super_Refcounted;
        pRVar4 = &(local_c0.brand.ptr)->super_Refcounted;
        local_c0.brand.ptr = pBVar1;
        (**(code **)*puVar2)
                  (puVar2,(pRVar3->super_Disposer)._vptr_Disposer[-2] +
                          (long)&(pRVar4->super_Disposer)._vptr_Disposer);
        pBVar1 = local_c0.brand.ptr;
      }
      local_c0.brand.ptr = pBVar1;
      local_c0.source._reader.dataSize = subSource._reader.dataSize;
      local_c0.source._reader.pointerCount = subSource._reader.pointerCount;
      local_c0.source._reader._38_2_ = subSource._reader._38_2_;
      local_c0.source._reader.nestingLimit = subSource._reader.nestingLimit;
      local_c0.source._reader._44_4_ = subSource._reader._44_4_;
      local_c0.source._reader.data = subSource._reader.data;
      local_c0.source._reader.pointers = subSource._reader.pointers;
      local_c0.source._reader.segment = subSource._reader.segment;
      local_c0.source._reader.capTable = subSource._reader.capTable;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_c0.body.tag;
      if (local_c0.body.tag == 2) {
        *(void **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             local_c0.body.field_1.forceAligned;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_c0.body.field_1._8_8_;
      }
      else if (local_c0.body.tag == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
             local_c0.body.field_1._32_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             local_c0.body.field_1._16_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             local_c0.body.field_1._24_8_;
        *(void **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             local_c0.body.field_1.forceAligned;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_c0.body.field_1._8_8_;
        *(byte *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) =
             local_c0.body.field_1.space[0x28];
        if (local_c0.body.field_1.space[0x28] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
               local_c0.body.field_1._80_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
               local_c0.body.field_1._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
               local_c0.body.field_1._64_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
               local_c0.body.field_1._72_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               local_c0.body.field_1._48_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
               local_c0.body.field_1._56_8_;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer =
           (Disposer *)CONCAT44(local_c0.brand.disposer._4_4_,local_c0.brand.disposer._0_4_);
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = local_c0.brand.ptr;
      local_c0.brand.ptr = (BrandScope *)0x0;
      pNVar5 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar5->field_1 + 0x98) = subSource._reader.dataSize;
      *(StructPointerCount *)((long)&pNVar5->field_1 + 0x9c) = subSource._reader.pointerCount;
      *(undefined2 *)((long)&pNVar5->field_1 + 0x9e) = subSource._reader._38_2_;
      *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = subSource._reader.nestingLimit
      ;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) =
           subSource._reader._44_4_;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data = subSource._reader.data;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
           subSource._reader.pointers;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = subSource._reader.segment
      ;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
           subSource._reader.capTable;
      if (local_c0.body.tag == 1) {
        local_c0.body.tag = 0;
      }
      if (local_c0.body.tag == 2) {
        local_c0.body.tag = 0;
      }
    }
    pBVar1 = pBStack_e0;
    if (pBStack_e0 != (BrandScope *)0x0) {
      pBStack_e0 = (BrandScope *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_e8._4_4_,local_e8._0_4_))
                ((undefined8 *)CONCAT44(local_e8._4_4_,local_e8._0_4_),
                 (pBVar1->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                 (long)&(pBVar1->super_Refcounted).super_Disposer._vptr_Disposer);
    }
    pDVar7 = pDStack_d0;
    pBVar6 = local_d8;
    if (local_d8 != (BrandedDecl *)0x0) {
      local_d8 = (BrandedDecl *)0x0;
      pDStack_d0 = (Disposer *)0x0;
      (**(local_c8->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_c8,pBVar6,0xa8,pDVar7,pDVar7,
                 kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>::
                 destruct);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandedDecl::applyParams(
    kj::Array<BrandedDecl> params, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return nullptr;
  } else {
    return brand->setParams(kj::mv(params), body.get<Resolver::ResolvedDecl>().kind, subSource)
        .map([&](kj::Own<BrandScope>&& scope) {
      BrandedDecl result = *this;
      result.brand = kj::mv(scope);
      result.source = subSource;
      return result;
    });
  }
}